

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Accuracy::Texture2DFilteringCase::init(Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  bool bVar1;
  int extraout_EAX;
  int iVar2;
  Archive *archive;
  size_type sVar3;
  Texture2D *this_00;
  reference ppTVar4;
  Texture2D *pTVar5;
  TextureFormat *format;
  PixelBufferAccess *pPVar6;
  undefined7 extraout_var;
  reference ppTVar7;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_190;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_188;
  iterator i;
  Vector<float,_4> local_178;
  Vector<float,_4> local_168;
  Vec4 local_158;
  RGBA local_148;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  Vec4 local_124;
  uint local_114;
  uint local_110;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  Vector<float,_4> local_f0;
  undefined1 local_e0 [8];
  Vec4 gMax;
  Vector<float,_4> local_c0;
  undefined1 local_b0 [8];
  Vec4 gMin;
  int levelNdx;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  int numLevels;
  int local_2c;
  Texture2D *pTStack_28;
  int ndx;
  Texture2DFilteringCase *local_10;
  Texture2DFilteringCase *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_filenames);
  if (bVar1) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(&this->m_textures,2);
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      this_00 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (this_00,this->m_renderCtx,this->m_internalFormat,this->m_width,this->m_height);
      unique0x10000868 = this_00;
      std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
                (&this->m_textures,(value_type *)(fmtInfo.lookupBias.m_data + 3));
    }
    iVar2 = de::max<int>(this->m_width,this->m_height);
    iVar2 = deLog2Floor32(iVar2);
    fmtInfo.lookupBias.m_data[2] = (float)(iVar2 + 1);
    ppTVar4 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,0);
    pTVar5 = glu::Texture2D::getRefTexture(*ppTVar4);
    format = tcu::TextureLevelPyramid::getFormat(&pTVar5->super_TextureLevelPyramid);
    tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),format);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
    tcu::operator-((tcu *)(gMin.m_data + 3),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)(cBias.m_data + 2));
    for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < (int)fmtInfo.lookupBias.m_data[2];
        gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-0.5,-0.5,-0.5,2.0);
      tcu::operator*((tcu *)&local_c0,(Vector<float,_4> *)(gMax.m_data + 2),
                     (Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)local_b0,&local_c0,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&step,1.0,1.0,1.0,0.0);
      tcu::operator*((tcu *)&local_f0,(Vector<float,_4> *)&step,
                     (Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)local_e0,&local_f0,(Vector<float,_4> *)(cScale.m_data + 2));
      ppTVar4 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,0);
      pTVar5 = glu::Texture2D::getRefTexture(*ppTVar4);
      tcu::Texture2D::allocLevel(pTVar5,(int)gMin.m_data[2]);
      ppTVar4 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,0);
      pTVar5 = glu::Texture2D::getRefTexture(*ppTVar4);
      pPVar6 = tcu::TextureLevelPyramid::getLevel
                         (&pTVar5->super_TextureLevelPyramid,(int)gMin.m_data[2]);
      tcu::fillWithComponentGradients(pPVar6,(Vec4 *)local_b0,(Vec4 *)local_e0);
    }
    for (rgb = 0; (int)rgb < (int)fmtInfo.lookupBias.m_data[2]; rgb = rgb + 1) {
      colorA = (deUint32)(0xffffff / (long)(int)fmtInfo.lookupBias.m_data[2]);
      colorB = colorA * rgb;
      local_110 = colorB | 0xff000000;
      local_114 = ~colorB | 0xff000000;
      ppTVar4 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,1);
      pTVar5 = glu::Texture2D::getRefTexture(*ppTVar4);
      tcu::Texture2D::allocLevel(pTVar5,rgb);
      ppTVar4 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,1);
      pTVar5 = glu::Texture2D::getRefTexture(*ppTVar4);
      pPVar6 = tcu::TextureLevelPyramid::getLevel(&pTVar5->super_TextureLevelPyramid,rgb);
      tcu::RGBA::RGBA(&local_148,local_110);
      tcu::RGBA::toVec((RGBA *)&local_144);
      tcu::operator*((tcu *)&local_134,&local_144,(Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)&local_124,&local_134,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::RGBA::RGBA((RGBA *)((long)&i._M_current + 4),local_114);
      tcu::RGBA::toVec((RGBA *)&local_178);
      tcu::operator*((tcu *)&local_168,&local_178,(Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)&local_158,&local_168,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::fillWithGrid(pPVar6,4,&local_124,&local_158);
    }
    local_188._M_current =
         (Texture2D **)
         std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::begin(&this->m_textures);
    while( true ) {
      local_190._M_current =
           (Texture2D **)
           std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::end(&this->m_textures);
      bVar1 = __gnu_cxx::operator!=(&local_188,&local_190);
      iVar2 = (int)CONCAT71(extraout_var,bVar1);
      if (!bVar1) break;
      ppTVar7 = __gnu_cxx::
                __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
                ::operator*(&local_188);
      (*(*ppTVar7)->_vptr_Texture2D[2])();
      __gnu_cxx::
      __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
      ::operator++(&local_188,0);
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(&this->m_textures,1);
    context = this->m_renderCtx;
    contextInfo = this->m_renderCtxInfo;
    archive = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_filenames);
    pTStack_28 = glu::Texture2D::create(context,contextInfo,archive,(int)sVar3,&this->m_filenames);
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
              (&this->m_textures,&stack0xffffffffffffffd8);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_internalFormat, m_width, m_height));

			const int				numLevels	= deLog2Floor32(de::max(m_width, m_height))+1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}